

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O0

void Commands::Info(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *arguments,Character *from)

{
  World *pWVar1;
  bool bVar2;
  Character *pCVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  const_reference pvVar7;
  Character *pCVar8;
  mapped_type *this;
  long lVar9;
  allocator<char> local_2f9;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  string local_298;
  allocator<char> local_271;
  string local_270;
  allocator<char> local_249;
  string local_248;
  string local_228;
  allocator<char> local_201;
  string local_200;
  string local_1e0;
  allocator<char> local_1b9;
  string local_1b8;
  string local_198;
  allocator<char> local_171;
  string local_170;
  string local_150;
  undefined1 local_130 [8];
  PacketBuilder reply;
  undefined1 local_e0 [8];
  string name;
  key_type local_b8;
  allocator<char> local_91;
  string local_90;
  string local_70;
  string local_40;
  Character *local_20;
  Character *victim;
  Character *from_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *arguments_local;
  
  pWVar1 = from->world;
  victim = from;
  from_local = (Character *)arguments;
  pvVar7 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](arguments,0);
  std::__cxx11::string::string((string *)&local_40,(string *)pvVar7);
  pCVar8 = World::GetCharacter(pWVar1,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  pCVar3 = victim;
  local_20 = pCVar8;
  if (pCVar8 == (Character *)0x0) {
    pWVar1 = victim->world;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"character_not_found",&local_91);
    I18N::Format<>(&local_70,&pWVar1->i18n,&local_90);
    (*(pCVar3->super_Command_Source)._vptr_Command_Source[5])(pCVar3,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator(&local_91);
  }
  else {
    uVar4 = (**(pCVar8->super_Command_Source)._vptr_Command_Source)();
    pWVar1 = victim->world;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"cmdprotect",(allocator<char> *)(name.field_2._M_local_buf + 0xf)
              );
    this = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
           ::operator[](&(pWVar1->admin_config).
                         super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                        ,&local_b8);
    iVar5 = util::variant::operator_cast_to_int(this);
    bVar2 = true;
    if (iVar5 <= (int)(uVar4 & 0xff)) {
      uVar4 = (**(local_20->super_Command_Source)._vptr_Command_Source)();
      uVar6 = (**(victim->super_Command_Source)._vptr_Command_Source)();
      bVar2 = (uVar4 & 0xff) <= (uVar6 & 0xff);
    }
    std::__cxx11::string::~string((string *)&local_b8);
    std::allocator<char>::~allocator((allocator<char> *)(name.field_2._M_local_buf + 0xf));
    pCVar3 = victim;
    if (bVar2) {
      (*(local_20->super_Command_Source)._vptr_Command_Source[2])();
      util::ucfirst((string *)local_e0,(string *)&reply.add_size);
      std::__cxx11::string::~string((string *)&reply.add_size);
      lVar9 = std::__cxx11::string::length();
      PacketBuilder::PacketBuilder
                ((PacketBuilder *)local_130,PACKET_ADMININTERACT,PACKET_TELL,lVar9 + 0x55);
      switch(local_20->admin) {
      case ADMIN_GUIDE:
        pWVar1 = victim->world;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_248,"light_guide_title",&local_249);
        I18N::Format<std::__cxx11::string&>
                  (&local_228,&pWVar1->i18n,&local_248,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0);
        PacketBuilder::AddString((PacketBuilder *)local_130,&local_228);
        std::__cxx11::string::~string((string *)&local_228);
        std::__cxx11::string::~string((string *)&local_248);
        std::allocator<char>::~allocator(&local_249);
        break;
      case ADMIN_GUARDIAN:
        pWVar1 = victim->world;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_200,"guardian_title",&local_201);
        I18N::Format<std::__cxx11::string&>
                  (&local_1e0,&pWVar1->i18n,&local_200,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0);
        PacketBuilder::AddString((PacketBuilder *)local_130,&local_1e0);
        std::__cxx11::string::~string((string *)&local_1e0);
        std::__cxx11::string::~string((string *)&local_200);
        std::allocator<char>::~allocator(&local_201);
        break;
      case ADMIN_GM:
        pWVar1 = victim->world;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1b8,"game_master_title",&local_1b9);
        I18N::Format<std::__cxx11::string&>
                  (&local_198,&pWVar1->i18n,&local_1b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0);
        PacketBuilder::AddString((PacketBuilder *)local_130,&local_198);
        std::__cxx11::string::~string((string *)&local_198);
        std::__cxx11::string::~string((string *)&local_1b8);
        std::allocator<char>::~allocator(&local_1b9);
        break;
      case ADMIN_HGM:
        pWVar1 = victim->world;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_170,"high_game_master_title",&local_171);
        I18N::Format<std::__cxx11::string&>
                  (&local_150,&pWVar1->i18n,&local_170,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0);
        PacketBuilder::AddString((PacketBuilder *)local_130,&local_150);
        std::__cxx11::string::~string((string *)&local_150);
        std::__cxx11::string::~string((string *)&local_170);
        std::allocator<char>::~allocator(&local_171);
        break;
      default:
        PacketBuilder::AddString((PacketBuilder *)local_130,(string *)local_e0);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_270," ",&local_271);
      PacketBuilder::AddString((PacketBuilder *)local_130,&local_270);
      std::__cxx11::string::~string((string *)&local_270);
      std::allocator<char>::~allocator(&local_271);
      Character::PaddedGuildTag_abi_cxx11_(&local_2b8,local_20);
      util::trim(&local_298,&local_2b8);
      PacketBuilder::AddBreakString((PacketBuilder *)local_130,&local_298,0xff);
      std::__cxx11::string::~string((string *)&local_298);
      std::__cxx11::string::~string((string *)&local_2b8);
      iVar5 = Character::Usage(local_20);
      PacketBuilder::AddInt((PacketBuilder *)local_130,iVar5);
      PacketBuilder::AddByte((PacketBuilder *)local_130,0xff);
      PacketBuilder::AddByte((PacketBuilder *)local_130,0xff);
      PacketBuilder::AddInt((PacketBuilder *)local_130,local_20->exp);
      PacketBuilder::AddChar((PacketBuilder *)local_130,(uint)local_20->level);
      PacketBuilder::AddShort((PacketBuilder *)local_130,(int)local_20->mapid);
      PacketBuilder::AddShort((PacketBuilder *)local_130,(uint)local_20->x);
      PacketBuilder::AddShort((PacketBuilder *)local_130,(uint)local_20->y);
      PacketBuilder::AddShort((PacketBuilder *)local_130,local_20->hp);
      PacketBuilder::AddShort((PacketBuilder *)local_130,local_20->maxhp);
      PacketBuilder::AddShort((PacketBuilder *)local_130,local_20->tp);
      PacketBuilder::AddShort((PacketBuilder *)local_130,local_20->maxtp);
      PacketBuilder::AddShort((PacketBuilder *)local_130,*local_20->display_str);
      PacketBuilder::AddShort((PacketBuilder *)local_130,*local_20->display_intl);
      PacketBuilder::AddShort((PacketBuilder *)local_130,*local_20->display_wis);
      PacketBuilder::AddShort((PacketBuilder *)local_130,*local_20->display_agi);
      PacketBuilder::AddShort((PacketBuilder *)local_130,*local_20->display_con);
      PacketBuilder::AddShort((PacketBuilder *)local_130,*local_20->display_cha);
      PacketBuilder::AddShort((PacketBuilder *)local_130,local_20->maxdam);
      PacketBuilder::AddShort((PacketBuilder *)local_130,local_20->mindam);
      PacketBuilder::AddShort((PacketBuilder *)local_130,local_20->accuracy);
      PacketBuilder::AddShort((PacketBuilder *)local_130,local_20->evade);
      PacketBuilder::AddShort((PacketBuilder *)local_130,local_20->armor);
      PacketBuilder::AddShort((PacketBuilder *)local_130,0);
      PacketBuilder::AddShort((PacketBuilder *)local_130,0);
      PacketBuilder::AddShort((PacketBuilder *)local_130,0);
      PacketBuilder::AddShort((PacketBuilder *)local_130,0);
      PacketBuilder::AddShort((PacketBuilder *)local_130,0);
      PacketBuilder::AddShort((PacketBuilder *)local_130,0);
      PacketBuilder::AddChar((PacketBuilder *)local_130,local_20->weight);
      PacketBuilder::AddChar((PacketBuilder *)local_130,local_20->maxweight);
      Character::Send(victim,(PacketBuilder *)local_130);
      PacketBuilder::~PacketBuilder((PacketBuilder *)local_130);
      std::__cxx11::string::~string((string *)local_e0);
    }
    else {
      pWVar1 = victim->world;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2f8,"command_access_denied",&local_2f9);
      I18N::Format<>(&local_2d8,&pWVar1->i18n,&local_2f8);
      (*(pCVar3->super_Command_Source)._vptr_Command_Source[5])(pCVar3,&local_2d8);
      std::__cxx11::string::~string((string *)&local_2d8);
      std::__cxx11::string::~string((string *)&local_2f8);
      std::allocator<char>::~allocator(&local_2f9);
    }
  }
  return;
}

Assistant:

void Info(const std::vector<std::string>& arguments, Character* from)
{
	Character *victim = from->world->GetCharacter(arguments[0]);

	if (!victim)
	{
		from->ServerMsg(from->world->i18n.Format("character_not_found"));
	}
	else
	{
		if (victim->SourceAccess() < int(from->world->admin_config["cmdprotect"])
		 || victim->SourceAccess() <= from->SourceAccess())
		{
			std::string name = util::ucfirst(victim->SourceName());

			PacketBuilder reply(PACKET_ADMININTERACT, PACKET_TELL, 85 + name.length());

			switch (victim->admin)
			{
				case ADMIN_HGM:      reply.AddString(from->world->i18n.Format("high_game_master_title", name)); break;
				case ADMIN_GM:       reply.AddString(from->world->i18n.Format("game_master_title", name)); break;
				case ADMIN_GUARDIAN: reply.AddString(from->world->i18n.Format("guardian_title", name)); break;
				case ADMIN_GUIDE:    reply.AddString(from->world->i18n.Format("light_guide_title", name)); break;
				default:             reply.AddString(name);
			}

			reply.AddString(" ");
			reply.AddBreakString(util::trim(victim->PaddedGuildTag()));
			reply.AddInt(victim->Usage());
			reply.AddByte(255);
			reply.AddByte(255);
			reply.AddInt(victim->exp);
			reply.AddChar(victim->level);
			reply.AddShort(victim->mapid);
			reply.AddShort(victim->x);
			reply.AddShort(victim->y);
			reply.AddShort(victim->hp);
			reply.AddShort(victim->maxhp);
			reply.AddShort(victim->tp);
			reply.AddShort(victim->maxtp);
			reply.AddShort(victim->display_str);
			reply.AddShort(victim->display_intl);
			reply.AddShort(victim->display_wis);
			reply.AddShort(victim->display_agi);
			reply.AddShort(victim->display_con);
			reply.AddShort(victim->display_cha);
			reply.AddShort(victim->maxdam);
			reply.AddShort(victim->mindam);
			reply.AddShort(victim->accuracy);
			reply.AddShort(victim->evade);
			reply.AddShort(victim->armor);
			reply.AddShort(0); // light
			reply.AddShort(0); // dark
			reply.AddShort(0); // fire
			reply.AddShort(0); // water
			reply.AddShort(0); // earth
			reply.AddShort(0); // wind
			reply.AddChar(victim->weight);
			reply.AddChar(victim->maxweight);

			from->Send(reply);
		}
		else
		{
			from->ServerMsg(from->world->i18n.Format("command_access_denied"));
		}
	}
}